

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void tokenize(list *list,char *func)

{
  byte ch;
  _Bool _Var1;
  TOKEN_TYPE TVar2;
  TOKEN_TYPE TVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char ch_00;
  
  current_type = T_None;
  current_token = (char *)malloc_(1);
  *current_token = '\0';
  lVar5 = 0;
  uVar7 = 0;
  do {
    sVar4 = strlen(func);
    if (sVar4 < uVar7) {
      if (*current_token != '\0') {
        addToken(list,current_token);
      }
      free(current_token);
      return;
    }
    lVar6 = lVar5 >> 0x20;
    ch_00 = func[lVar6];
    if ((ch_00 != ' ') && (ch_00 != ',')) {
      if (current_type == T_None) {
        current_type = getType(ch_00);
        ch_00 = func[lVar6];
      }
      TVar3 = current_type;
      TVar2 = getType(ch_00);
      if ((TVar3 == T_Operator) || (TVar2 != TVar3)) {
        addToken(list,current_token);
        free(current_token);
        current_token = (char *)malloc_(1);
        *current_token = '\0';
        current_type = getType(func[lVar6]);
        ch_00 = func[lVar6];
      }
      if ((ch_00 == '-') || (ch_00 == '+')) {
        if (0 < (int)(uint)uVar7) {
          ch = func[(ulong)((uint)uVar7 & 0x7fffffff) - 1];
          TVar3 = getType(ch);
          if (((TVar3 != T_Operator) || ((ch | 8) == 0x29)) ||
             ((list->last != (token *)0x0 && (_Var1 = isNumber(list->last->value), _Var1))))
          goto LAB_00103ccc;
        }
        current_type = T_Operand;
        free(current_token);
        current_token = (char *)malloc_(2);
        *current_token = func[lVar6];
        current_token[1] = '\0';
      }
      else {
LAB_00103ccc:
        appendChar(&current_token,ch_00);
      }
    }
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0x100000000;
  } while( true );
}

Assistant:

void tokenize(struct list *list, const char *func)
{
    size_t i;

    current_type = T_None;
    current_token = malloc_(1);
    current_token[0] = '\0';

    for (i = 0; i <= strlen(func); i++) {
        processChar(list, func, i);
    }

    if (strlen(current_token) > 0) {
        addToken(list, current_token);
    }

    free(current_token);
}